

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O0

void __thiscall
rudp::rudp_server::rudp_server
          (rudp_server *this,io_service *ios,uint16_t p,
          function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
          *cb_)

{
  udp local_48;
  basic_endpoint<boost::asio::ip::udp> local_44;
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  *local_28;
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  *cb__local;
  io_service *piStack_18;
  uint16_t p_local;
  io_service *ios_local;
  rudp_server *this_local;
  
  this->io_service = ios;
  this->port = p;
  local_28 = cb_;
  cb__local._6_2_ = p;
  piStack_18 = ios;
  ios_local = (io_service *)this;
  local_48 = boost::asio::ip::udp::v4();
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_44,&local_48,cb__local._6_2_);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_datagram_socket<boost::asio::io_context>(&this->socket,ios,&local_44,(type *)0x0);
  std::
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  ::function(&this->cb,local_28);
  std::
  map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
  ::map(&this->sessions);
  std::
  map<unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::map(&this->session_bindings);
  receive(this);
  return;
}

Assistant:

rudp_server( boost::asio::io_service &ios, uint16_t p, const std::function< void( rudp_server&, uint32_t, const buffers_ptr_t& ) > &cb_ ) : io_service( ios ), socket( ios, boost::asio::ip::udp::endpoint( boost::asio::ip::udp::v4(), p ) ), port( p ), cb( cb_ ) {
    receive();
  }